

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void ftruncate_cb(uv_fs_t *req)

{
  int iVar1;
  int r;
  uv_fs_t *req_local;
  
  if (req != &ftruncate_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x186,"req == &ftruncate_req");
    abort();
  }
  if (ftruncate_req.fs_type != UV_FS_FTRUNCATE) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x187,"req->fs_type == UV_FS_FTRUNCATE");
    abort();
  }
  if (ftruncate_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x188,"req->result == 0");
    abort();
  }
  ftruncate_cb_count = ftruncate_cb_count + 1;
  uv_fs_req_cleanup(&ftruncate_req);
  iVar1 = uv_fs_close(loop,&close_req,open_req1.result & 0xffffffff,close_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x18c,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void ftruncate_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &ftruncate_req);
  ASSERT(req->fs_type == UV_FS_FTRUNCATE);
  ASSERT(req->result == 0);
  ftruncate_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  ASSERT(r == 0);
}